

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeMakeReady(Vdbe *p,Parse *pParse)

{
  short sVar1;
  ushort uVar2;
  sqlite3 *db;
  Op *pOVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  ushort uVar8;
  int iVar9;
  long lVar10;
  Mem *pMVar11;
  void *pvVar12;
  VdbeCursor **ppVVar13;
  sqlite3 **ppsVar14;
  ulong uVar15;
  Mem *pMVar16;
  Mem **ppMVar17;
  int iVar18;
  int iVar19;
  u64 uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  u64 uVar24;
  ulong uVar25;
  size_t __n;
  int nArg;
  int local_4c;
  long local_48;
  long local_40;
  long local_38;
  
  db = p->db;
  sVar1 = pParse->nVar;
  iVar9 = pParse->nTab;
  local_38 = (long)iVar9;
  local_4c = pParse->nMaxArg;
  iVar18 = pParse->nMem + iVar9;
  iVar18 = (uint)(0 < iVar18 && local_38 == 0) + iVar18;
  lVar10 = (long)(p->nOp * 0x18);
  pOVar3 = p->aOp;
  uVar25 = pParse->szOpAlloc - lVar10 & 0xfffffffffffffff8;
  resolveP2Values(p,&local_4c);
  lVar7 = local_38;
  if (pParse->isMultiWrite == '\0') {
    uVar8 = 0;
  }
  else {
    uVar8 = (ushort)(pParse->mayAbort != '\0') << 7;
  }
  uVar2 = *(ushort *)&p->field_0xc5;
  *(ushort *)&p->field_0xc5 = uVar8 | uVar2 & 0xff7f;
  iVar19 = 10;
  if (10 < iVar18) {
    iVar19 = iVar18;
  }
  if (pParse->explain == '\0') {
    iVar19 = iVar18;
  }
  *(ushort *)&p->field_0xc5 = uVar8 | uVar2 & 0xff7c;
  local_48 = (long)iVar19 * 0x38;
  pMVar11 = (Mem *)0x0;
  uVar15 = uVar25 + (long)iVar19 * -0x38;
  pMVar16 = (Mem *)((long)pOVar3 + uVar15 + lVar10);
  lVar4 = 0;
  if (SBORROW8(uVar25,local_48) != (long)uVar15 < 0) {
    pMVar16 = pMVar11;
    lVar4 = local_48;
    uVar15 = uVar25;
  }
  p->aMem = pMVar16;
  local_40 = (long)sVar1 * 0x38;
  uVar25 = uVar15 + (long)sVar1 * -0x38;
  pMVar16 = (Mem *)((long)pOVar3 + uVar25 + lVar10);
  lVar5 = 0;
  if (SBORROW8(uVar15,local_40) != (long)uVar25 < 0) {
    pMVar16 = pMVar11;
    lVar5 = local_40;
    uVar25 = uVar15;
  }
  p->aVar = pMVar16;
  lVar22 = (long)local_4c;
  lVar23 = lVar22 * 8;
  uVar15 = uVar25 + lVar22 * -8;
  lVar21 = 0;
  if ((long)uVar25 < lVar23) {
    lVar21 = lVar23;
  }
  pMVar16 = (Mem *)((long)pOVar3 + uVar15 + lVar10);
  if (SBORROW8(uVar25,lVar23) != (long)uVar15 < 0) {
    pMVar16 = pMVar11;
    uVar15 = uVar25;
  }
  p->apArg = (Mem **)pMVar16;
  __n = local_38 * 8;
  pMVar16 = (Mem *)((long)pOVar3 + uVar15 + local_38 * -8 + lVar10);
  sVar6 = 0;
  if ((long)uVar15 < (long)__n) {
    pMVar16 = pMVar11;
    sVar6 = __n;
  }
  p->apCsr = (VdbeCursor **)pMVar16;
  uVar24 = sVar6 + lVar21 + lVar5 + lVar4;
  if (uVar24 != 0) {
    pvVar12 = sqlite3DbMallocRawNN(db,uVar24);
    p->pFree = pvVar12;
    if (db->mallocFailed == '\0') {
      pMVar16 = p->aMem;
      uVar20 = uVar24;
      if (pMVar16 == (Mem *)0x0) {
        uVar20 = uVar24 - local_48;
        if ((long)uVar24 < local_48) {
          pMVar16 = (Mem *)0x0;
          uVar20 = uVar24;
        }
        else {
          pMVar16 = (Mem *)((long)pvVar12 + uVar20);
        }
      }
      p->aMem = pMVar16;
      pMVar16 = p->aVar;
      uVar24 = uVar20;
      if (pMVar16 == (Mem *)0x0) {
        uVar24 = uVar20 - local_40;
        if ((long)uVar20 < local_40) {
          pMVar16 = (Mem *)0x0;
          uVar24 = uVar20;
        }
        else {
          pMVar16 = (Mem *)((long)pvVar12 + uVar24);
        }
      }
      p->aVar = pMVar16;
      ppMVar17 = p->apArg;
      uVar20 = uVar24;
      if (ppMVar17 == (Mem **)0x0) {
        uVar20 = uVar24 + lVar22 * -8;
        if ((long)uVar24 < lVar23) {
          ppMVar17 = (Mem **)0x0;
          uVar20 = uVar24;
        }
        else {
          ppMVar17 = (Mem **)((long)pvVar12 + uVar20);
        }
      }
      p->apArg = ppMVar17;
      ppVVar13 = p->apCsr;
      if (ppVVar13 == (VdbeCursor **)0x0) {
        if ((long)uVar20 < (long)__n) {
          ppVVar13 = (VdbeCursor **)0x0;
        }
        else {
          ppVVar13 = (VdbeCursor **)((long)pvVar12 + uVar20 + lVar7 * -8);
        }
      }
      p->apCsr = ppVVar13;
    }
  }
  p->pVList = pParse->pVList;
  pParse->pVList = (VList *)0x0;
  *(ushort *)&p->field_0xc5 = (*(ushort *)&p->field_0xc5 & 0xfff3) + (pParse->explain & 3) * 4;
  if (db->mallocFailed == '\0') {
    p->nCursor = iVar9;
    p->nVar = sVar1;
    if (0 < sVar1) {
      ppsVar14 = &p->aVar->db;
      iVar9 = sVar1 + 1;
      do {
        *ppsVar14 = db;
        *(u16 *)(ppsVar14 + -4) = 1;
        *(int *)(ppsVar14 + -1) = 0;
        ppsVar14 = ppsVar14 + 7;
        iVar9 = iVar9 + -1;
      } while (1 < iVar9);
    }
    p->nMem = iVar19;
    if (0 < iVar19) {
      ppsVar14 = &p->aMem->db;
      iVar19 = iVar19 + 1;
      do {
        *ppsVar14 = db;
        *(u16 *)(ppsVar14 + -4) = 0x80;
        *(int *)(ppsVar14 + -1) = 0;
        ppsVar14 = ppsVar14 + 7;
        iVar19 = iVar19 + -1;
      } while (1 < iVar19);
    }
    memset(p->apCsr,0,__n);
  }
  else {
    p->nVar = 0;
    p->nMem = 0;
    p->nCursor = 0;
  }
  p->magic = 0x2df20da3;
  p->rc = 0;
  p->errorAction = '\x02';
  p->minWriteFileFormat = 0xff;
  p->nChange = 0;
  p->iStatement = 0;
  p->cacheCtr = 1;
  p->pc = -1;
  p->nFkConstraint = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMakeReady(
  Vdbe *p,                       /* The VDBE */
  Parse *pParse                  /* Parsing context */
){
  sqlite3 *db;                   /* The database connection */
  int nVar;                      /* Number of parameters */
  int nMem;                      /* Number of VM memory registers */
  int nCursor;                   /* Number of cursors required */
  int nArg;                      /* Number of arguments in subprograms */
  int n;                         /* Loop counter */
  struct ReusableSpace x;        /* Reusable bulk memory */

  assert( p!=0 );
  assert( p->nOp>0 );
  assert( pParse!=0 );
  assert( p->magic==VDBE_MAGIC_INIT );
  assert( pParse==p->pParse );
  db = p->db;
  assert( db->mallocFailed==0 );
  nVar = pParse->nVar;
  nMem = pParse->nMem;
  nCursor = pParse->nTab;
  nArg = pParse->nMaxArg;
  
  /* Each cursor uses a memory cell.  The first cursor (cursor 0) can
  ** use aMem[0] which is not otherwise used by the VDBE program.  Allocate
  ** space at the end of aMem[] for cursors 1 and greater.
  ** See also: allocateCursor().
  */
  nMem += nCursor;
  if( nCursor==0 && nMem>0 ) nMem++;  /* Space for aMem[0] even if not used */

  /* Figure out how much reusable memory is available at the end of the
  ** opcode array.  This extra memory will be reallocated for other elements
  ** of the prepared statement.
  */
  n = ROUND8(sizeof(Op)*p->nOp);              /* Bytes of opcode memory used */
  x.pSpace = &((u8*)p->aOp)[n];               /* Unused opcode memory */
  assert( EIGHT_BYTE_ALIGNMENT(x.pSpace) );
  x.nFree = ROUNDDOWN8(pParse->szOpAlloc - n);  /* Bytes of unused memory */
  assert( x.nFree>=0 );
  assert( EIGHT_BYTE_ALIGNMENT(&x.pSpace[x.nFree]) );

  resolveP2Values(p, &nArg);
  p->usesStmtJournal = (u8)(pParse->isMultiWrite && pParse->mayAbort);
  if( pParse->explain && nMem<10 ){
    nMem = 10;
  }
  p->expired = 0;

  /* Memory for registers, parameters, cursor, etc, is allocated in one or two
  ** passes.  On the first pass, we try to reuse unused memory at the 
  ** end of the opcode array.  If we are unable to satisfy all memory
  ** requirements by reusing the opcode array tail, then the second
  ** pass will fill in the remainder using a fresh memory allocation.  
  **
  ** This two-pass approach that reuses as much memory as possible from
  ** the leftover memory at the end of the opcode array.  This can significantly
  ** reduce the amount of memory held by a prepared statement.
  */
  x.nNeeded = 0;
  p->aMem = allocSpace(&x, 0, nMem*sizeof(Mem));
  p->aVar = allocSpace(&x, 0, nVar*sizeof(Mem));
  p->apArg = allocSpace(&x, 0, nArg*sizeof(Mem*));
  p->apCsr = allocSpace(&x, 0, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  p->anExec = allocSpace(&x, 0, p->nOp*sizeof(i64));
#endif
  if( x.nNeeded ){
    x.pSpace = p->pFree = sqlite3DbMallocRawNN(db, x.nNeeded);
    x.nFree = x.nNeeded;
    if( !db->mallocFailed ){
      p->aMem = allocSpace(&x, p->aMem, nMem*sizeof(Mem));
      p->aVar = allocSpace(&x, p->aVar, nVar*sizeof(Mem));
      p->apArg = allocSpace(&x, p->apArg, nArg*sizeof(Mem*));
      p->apCsr = allocSpace(&x, p->apCsr, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
      p->anExec = allocSpace(&x, p->anExec, p->nOp*sizeof(i64));
#endif
    }
  }

  p->pVList = pParse->pVList;
  pParse->pVList =  0;
  p->explain = pParse->explain;
  if( db->mallocFailed ){
    p->nVar = 0;
    p->nCursor = 0;
    p->nMem = 0;
  }else{
    p->nCursor = nCursor;
    p->nVar = (ynVar)nVar;
    initMemArray(p->aVar, nVar, db, MEM_Null);
    p->nMem = nMem;
    initMemArray(p->aMem, nMem, db, MEM_Undefined);
    memset(p->apCsr, 0, nCursor*sizeof(VdbeCursor*));
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
    memset(p->anExec, 0, p->nOp*sizeof(i64));
#endif
  }
  sqlite3VdbeRewind(p);
}